

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_provider.cc
# Opt level: O2

int main(void)

{
  uint __line;
  bool bVar1;
  uchar *in_RCX;
  size_t n;
  uchar *d_00;
  char *__assertion;
  MD5 m;
  string local_58;
  string initial;
  Digest d;
  
  QPDFCryptoProvider::getDefaultProvider_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"potato",(allocator<char> *)&m);
  QPDFCryptoProvider::registerImpl<Potato>(&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"potato",(allocator<char> *)&m);
  QPDFCryptoProvider::setDefaultProvider(&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  QPDFCryptoProvider::getDefaultProvider_abi_cxx11_();
  d_00 = "potato";
  bVar1 = std::operator==(&local_58,"potato");
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_58);
    MD5::MD5(&m,d_00,n,in_RCX);
    MD5::encodeString(&m,"quack");
    MD5::digest(&m,d);
    MD5::unparse_abi_cxx11_(&local_58,&m);
    bVar1 = std::operator==(&local_58,"30313233343536373839616263646566");
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_58);
      std::operator<<((ostream *)&std::cout,"assertions passed\n");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&m.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&initial);
      return 0;
    }
    __assertion = "m.unparse() == \"30313233343536373839616263646566\"";
    __line = 0x5f;
  }
  else {
    __assertion = "QPDFCryptoProvider::getDefaultProvider() == \"potato\"";
    __line = 0x59;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/crypto_provider.cc"
                ,__line,"int main()");
}

Assistant:

int
main()
{
    auto initial = QPDFCryptoProvider::getDefaultProvider();
    QPDFCryptoProvider::registerImpl<Potato>("potato");
    QPDFCryptoProvider::setDefaultProvider("potato");
    assert(QPDFCryptoProvider::getDefaultProvider() == "potato");
    MD5 m;
    m.encodeString("quack"); // anything
    MD5::Digest d;
    m.digest(d);
    // hex for 0123456789abcdef
    assert(m.unparse() == "30313233343536373839616263646566");
    std::cout << "assertions passed\n";
    return 0;
}